

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O1

Expected<renderdesc::Command::Index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::Loader::getTextureIndex
          (Expected<renderdesc::Command::Index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  string local_58;
  Index local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->names_).texture.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->names_).texture.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current ==
      (this->names_).texture.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    format_abi_cxx11_(&local_58,"Unknown texture %s",(s->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      local_28._8_8_ = local_58.field_2._8_8_;
      local_38 = (Index)&local_28;
    }
    else {
      local_38 = (Index)local_58._M_dataplus._M_p;
    }
    local_28._M_allocated_capacity._1_7_ = local_58.field_2._M_allocated_capacity._1_7_;
    local_28._M_local_buf[0] = local_58.field_2._M_local_buf[0];
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if (local_38 == (Index)&local_28) {
      paVar1->_M_allocated_capacity = local_28._0_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           local_28._8_8_;
    }
    else {
      (__return_storage_ptr__->field_0).value_ = local_38;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_28._0_8_
      ;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_58._M_string_length;
    __return_storage_ptr__->has_value_ = false;
  }
  else {
    (__return_storage_ptr__->field_0).value_ =
         *(Index *)((long)&((this->indexes_).texture.
                            super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                            ._M_impl.super__Vector_impl_data._M_start)->index +
                   ((long)_Var2._M_current -
                    (long)(this->names_).texture.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2));
    __return_storage_ptr__->has_value_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<Command::Index, std::string> getTextureIndex(const std::string &s) {
		const auto it = std::find(names_.texture.begin(), names_.texture.end(), s);
		if (it == names_.texture.end())
			return Unexpected(format("Unknown texture %s", s.c_str()));

		return indexes_.texture[it - names_.texture.begin()];
	}